

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_param.cc
# Opt level: O2

string * ParamDecls_abi_cxx11_(string *__return_storage_ptr__,ParamList *params)

{
  bool bVar1;
  pointer ppPVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (params != (ParamList *)0x0) {
    bVar1 = false;
    for (ppPVar2 = (params->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppPVar2 !=
        (params->super__Vector_base<Param_*,_std::allocator<Param_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppPVar2 = ppPVar2 + 1) {
      if (bVar1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar1 = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ParamDecls(ParamList* params)
	{
	string param_decls;

	int first = 1;
	foreach (i, ParamList, params)
		{
		Param* p = *i;
		const char* decl_str = p->decl_str().c_str();
		if ( first )
			first = 0;
		else
			param_decls += ", ";
		param_decls += decl_str;
		}
	return param_decls;
	}